

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O1

Test * SubprocessTestTokenAvailable::Create(void)

{
  Test *pTVar1;
  
  pTVar1 = (Test *)operator_new(0x2d8);
  pTVar1->failed_ = false;
  pTVar1->assertion_failures_ = 0;
  pTVar1->_vptr_Test = (_func_int **)&PTR__SubprocessTest_001fd178;
  SubprocessSet::SubprocessSet((SubprocessSet *)(pTVar1 + 1));
  *(undefined ***)&pTVar1[0x2c].failed_ = &PTR__TokenPool_001fd1b0;
  pTVar1->_vptr_Test = (_func_int **)&PTR__SubprocessTest_001fd0d8;
  g_current_test = pTVar1;
  return pTVar1;
}

Assistant:

TEST_F(SubprocessTest, TokenAvailable) {
  Subprocess* subproc = subprocs_.Add(kSimpleCommand);
  ASSERT_NE((Subprocess *) 0, subproc);

  // simulate GNUmake jobserver pipe with 1 token
#ifdef _WIN32
  tokens_._token_available = true;
#else
  int fds[2];
  ASSERT_EQ(0u, pipe(fds));
  tokens_._fd = fds[0];
  ASSERT_EQ(1u, write(fds[1], "T", 1));
#endif

  subprocs_.ResetTokenAvailable();
  subprocs_.DoWork(&tokens_);
#ifdef _WIN32
  tokens_._token_available = false;
  // we need to loop here as we have no conrol where the token
  // I/O completion post ends up in the queue
  while (!subproc->Done() && !subprocs_.IsTokenAvailable()) {
    subprocs_.DoWork(&tokens_);
  }
#endif

  EXPECT_TRUE(subprocs_.IsTokenAvailable());
  EXPECT_EQ(0u, subprocs_.finished_.size());

  // remove token to let DoWork() wait for command again
#ifndef _WIN32
  char token;
  ASSERT_EQ(1u, read(fds[0], &token, 1));
#endif

  while (!subproc->Done()) {
    subprocs_.DoWork(&tokens_);
  }

#ifndef _WIN32
  close(fds[1]);
  close(fds[0]);
#endif

  EXPECT_EQ(ExitSuccess, subproc->Finish());
  EXPECT_NE("", subproc->GetOutput());

  EXPECT_EQ(1u, subprocs_.finished_.size());
}